

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutomationBasic.cpp
# Opt level: O1

void __thiscall AutomationBasic::reread(AutomationBasic *this)

{
  _Rb_tree_node_base *__args;
  PolledFile *pPVar1;
  pointer puVar2;
  char cVar3;
  undefined8 uVar4;
  int iVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  _Rb_tree_node_base *p_Var7;
  char *in_RCX;
  int iVar8;
  nfds_t in_RDX;
  ulong uVar9;
  uint uVar10;
  Value *this_00;
  bool bVar11;
  string_view s;
  ExpectedRef<const_std::string,_std::string> float_string;
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float;
  Keypoint kp;
  ExpectedRef<const_Sequence,_std::string> row;
  ExpectedRef<const_Sequence,_std::string> sequence;
  Data new_data;
  ExpectedRef<const_Mapping,_std::string> map;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed;
  undefined1 local_1f8 [32];
  char local_1d8;
  undefined1 local_1d0 [32];
  char local_1b0;
  undefined1 local_1a8 [8];
  undefined1 auStack_1a0 [8];
  float local_198;
  undefined1 local_188 [32];
  char local_168;
  undefined1 local_160 [8];
  Keypoint *local_158;
  iterator iStack_150;
  Keypoint *local_148;
  undefined1 local_140 [32];
  char local_120;
  AutomationBasic *local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
  local_110;
  _Rb_tree_node_base *local_e0;
  Value *local_d8;
  undefined1 local_d0 [32];
  char local_b0;
  anon_union_112_2_9b3c4038_for_Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_a8;
  char local_38;
  
  pPVar1 = (this->source_)._M_t.super___uniq_ptr_impl<PolledFile,_std::default_delete<PolledFile>_>.
           _M_t.super__Tuple_impl<0UL,_PolledFile_*,_std::default_delete<PolledFile>_>.
           super__Head_base<0UL,_PolledFile_*,_false>._M_head_impl;
  uVar10 = this->seq_ + 1;
  this->seq_ = uVar10;
  iVar5 = PolledFile::poll(pPVar1,(pollfd *)(ulong)uVar10,in_RDX,(int)in_RCX);
  if ((char)iVar5 != '\0') {
    pPVar1 = (this->source_)._M_t.
             super___uniq_ptr_impl<PolledFile,_std::default_delete<PolledFile>_>._M_t.
             super__Tuple_impl<0UL,_PolledFile_*,_std::default_delete<PolledFile>_>.
             super__Head_base<0UL,_PolledFile_*,_false>._M_head_impl;
    local_118 = this;
    pvVar6 = PolledFile::data(pPVar1);
    puVar2 = (pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar6 = PolledFile::data(pPVar1);
    s._M_str = in_RCX;
    s._M_len = (size_t)puVar2;
    yaml::parse_abi_cxx11_
              ((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8.value_,
               (yaml *)((pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish +
                       -(long)(pvVar6->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start),s);
    if (local_38 == '\0') {
      aAppDebugPrintf("Automation parsing failed: %s",local_a8.error_.error_._M_dataplus._M_p);
    }
    else {
      yaml::Value::getMapping_abi_cxx11_
                ((ExpectedRef<const_Mapping,_std::string> *)
                 &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_d0)->value_,&local_a8.value_);
      if (local_b0 == '\0') {
        aAppDebugPrintf("Automation must start with mapping: %s",local_d0._0_8_);
      }
      else {
        local_110._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_110._M_impl.super__Rb_tree_header._M_header;
        local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var7 = *(_Base_ptr *)(local_d0._0_8_ + 0x18);
        local_e0 = (_Rb_tree_node_base *)(local_d0._0_8_ + 8);
        local_110._M_impl.super__Rb_tree_header._M_header._M_right =
             local_110._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var7 != local_e0) {
          do {
            yaml::Value::getSequence_abi_cxx11_
                      ((ExpectedRef<const_Sequence,_std::string> *)
                       &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                          *)local_140)->value_,(Value *)(p_Var7 + 2));
            __args = p_Var7 + 1;
            if (local_120 == '\0') {
              aAppDebugPrintf("Error parsing %s: %s",*(undefined8 *)__args,local_140._0_8_);
              if ((local_120 == '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_140)->error_).error_ + 0x10U))) {
                operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
              }
              goto LAB_0010be94;
            }
            local_160._0_4_ = 0;
            local_158 = (Keypoint *)0x0;
            iStack_150._M_current = (Keypoint *)0x0;
            local_148 = (Keypoint *)0x0;
            this_00 = *(Value **)local_140._0_8_;
            local_d8 = *(pointer *)(local_140._0_8_ + 8);
            bVar11 = this_00 == local_d8;
            while (!bVar11) {
              yaml::Value::getSequence_abi_cxx11_
                        ((ExpectedRef<const_Sequence,_std::string> *)
                         &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                            *)local_188)->value_,this_00);
              uVar4 = local_188._0_8_;
              if (local_168 == '\0') {
                aAppDebugPrintf("Error parsing %s row: %s",*(undefined8 *)__args,local_188._0_8_);
LAB_0010bced:
                if ((local_168 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_188)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
                }
                goto LAB_0010bd19;
              }
              uVar9 = ((long)*(pointer *)(local_188._0_8_ + 8) - *(long *)local_188._0_8_ >> 4) *
                      0x6db6db6db6db6db7;
              if (uVar9 < 2) {
                aAppDebugPrintf("Error parsing %s row: should be at least [t, x]",
                                *(undefined8 *)__args);
                goto LAB_0010bced;
              }
              if (5 < uVar9) {
                aAppDebugPrintf("Error parsing %s row: too many components %d, max 4",
                                *(undefined8 *)__args);
                goto LAB_0010bced;
              }
              iVar8 = (int)uVar9 + -1;
              iVar5 = iVar8;
              if ((local_160._0_4_ != 0) && (iVar5 = local_160._0_4_, local_160._0_4_ != iVar8)) {
                aAppDebugPrintf("Error parsing %s row: inconsistent number of components %d, %d expected"
                                ,*(undefined8 *)__args);
                goto LAB_0010bced;
              }
              local_160._0_4_ = iVar5;
              local_1a8._0_4_ = 0.0;
              local_1a8._4_4_ = 0.0;
              auStack_1a0._0_4_ = 0.0;
              auStack_1a0._4_4_ = 0.0;
              local_198 = 0.0;
              yaml::Value::getString_abi_cxx11_
                        ((ExpectedRef<const_std::string,_std::string> *)
                         &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                            *)local_1f8)->value_,*(Value **)local_188._0_8_);
              if (local_1d8 == '\0') {
                aAppDebugPrintf("Error parsing %s row time: %s",*(undefined8 *)__args,
                                local_1f8._0_8_);
LAB_0010bccb:
                if ((local_1d8 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1f8)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                }
                goto LAB_0010bced;
              }
              floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                    *)local_1d0)->error_,(string *)local_1f8._0_8_);
              cVar3 = local_1b0;
              if (local_1b0 == '\0') {
                aAppDebugPrintf("Error parsing %s row time: %s",*(undefined8 *)__args,
                                CONCAT44(local_1d0._4_4_,local_1d0._0_4_));
              }
              else {
                local_1a8._0_4_ = local_1d0._0_4_;
              }
              if ((local_1b0 == '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_1d0)->error_).error_ + 0x10U))) {
                operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),
                                local_1d0._16_8_ + 1);
              }
              if ((local_1d8 == '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_1f8)->error_).error_ + 0x10U))) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
              if (cVar3 == '\0') goto LAB_0010bced;
              yaml::Value::getString_abi_cxx11_
                        ((ExpectedRef<const_std::string,_std::string> *)
                         &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                            *)local_1f8)->value_,(Value *)(*(long *)uVar4 + 0x70));
              if (local_1d8 == '\0') {
                aAppDebugPrintf("Error parsing %s row x: %s",*(undefined8 *)__args,local_1f8._0_8_);
                goto LAB_0010bccb;
              }
              floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                    *)local_1d0)->error_,(string *)local_1f8._0_8_);
              cVar3 = local_1b0;
              if (local_1b0 == '\0') {
                aAppDebugPrintf("Error parsing %s row x: %s",*(undefined8 *)__args,
                                CONCAT44(local_1d0._4_4_,local_1d0._0_4_));
              }
              else {
                local_1a8._4_4_ = local_1d0._0_4_;
              }
              if ((local_1b0 == '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_1d0)->error_).error_ + 0x10U))) {
                operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),
                                local_1d0._16_8_ + 1);
              }
              if ((local_1d8 == '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_1f8)->error_).error_ + 0x10U))) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
              if (cVar3 == '\0') goto LAB_0010bced;
              if (2 < (ulong)(((long)*(pointer *)(uVar4 + 8) - *(long *)uVar4 >> 4) *
                             0x6db6db6db6db6db7)) {
                yaml::Value::getString_abi_cxx11_
                          ((ExpectedRef<const_std::string,_std::string> *)
                           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_1f8)->value_,(Value *)(*(long *)uVar4 + 0xe0));
                if (local_1d8 == '\0') {
                  aAppDebugPrintf("Error parsing %s row y: %s",*(undefined8 *)__args,local_1f8._0_8_
                                 );
                  goto LAB_0010bccb;
                }
                floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                      *)local_1d0)->error_,(string *)local_1f8._0_8_);
                cVar3 = local_1b0;
                if (local_1b0 == '\0') {
                  aAppDebugPrintf("Error parsing %s row y: %s",*(undefined8 *)__args,
                                  CONCAT44(local_1d0._4_4_,local_1d0._0_4_));
                }
                else {
                  auStack_1a0._0_4_ = local_1d0._0_4_;
                }
                if ((local_1b0 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1d0)->error_).error_ + 0x10U))) {
                  operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),
                                  local_1d0._16_8_ + 1);
                }
                if ((local_1d8 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1f8)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                }
                if (cVar3 == '\0') goto LAB_0010bced;
              }
              if (3 < (ulong)(((long)*(pointer *)(uVar4 + 8) - *(long *)uVar4 >> 4) *
                             0x6db6db6db6db6db7)) {
                yaml::Value::getString_abi_cxx11_
                          ((ExpectedRef<const_std::string,_std::string> *)
                           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_1f8)->value_,(Value *)(*(long *)uVar4 + 0x150));
                if (local_1d8 == '\0') {
                  aAppDebugPrintf("Error parsing %s row z: %s",*(undefined8 *)__args,local_1f8._0_8_
                                 );
                  goto LAB_0010bccb;
                }
                floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                      *)local_1d0)->error_,(string *)local_1f8._0_8_);
                cVar3 = local_1b0;
                if (local_1b0 == '\0') {
                  aAppDebugPrintf("Error parsing %s row z: %s",*(undefined8 *)__args,
                                  CONCAT44(local_1d0._4_4_,local_1d0._0_4_));
                }
                else {
                  auStack_1a0._4_4_ = local_1d0._0_4_;
                }
                if ((local_1b0 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1d0)->error_).error_ + 0x10U))) {
                  operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),
                                  local_1d0._16_8_ + 1);
                }
                if ((local_1d8 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1f8)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                }
                if (cVar3 == '\0') goto LAB_0010bced;
              }
              if (4 < (ulong)(((long)*(pointer *)(uVar4 + 8) - *(long *)uVar4 >> 4) *
                             0x6db6db6db6db6db7)) {
                yaml::Value::getString_abi_cxx11_
                          ((ExpectedRef<const_std::string,_std::string> *)
                           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_1f8)->value_,(Value *)(*(long *)uVar4 + 0x1c0));
                if (local_1d8 == '\0') {
                  aAppDebugPrintf("Error parsing %s row w: %s",*(undefined8 *)__args,local_1f8._0_8_
                                 );
                  goto LAB_0010bccb;
                }
                floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                      *)local_1d0)->error_,(string *)local_1f8._0_8_);
                cVar3 = local_1b0;
                if (local_1b0 == '\0') {
                  aAppDebugPrintf("Error parsing %s row w: %s",*(undefined8 *)__args,
                                  CONCAT44(local_1d0._4_4_,local_1d0._0_4_));
                }
                else {
                  local_198 = (float)local_1d0._0_4_;
                }
                if ((local_1b0 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1d0)->error_).error_ + 0x10U))) {
                  operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),
                                  local_1d0._16_8_ + 1);
                }
                if ((local_1d8 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1f8)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                }
                if (cVar3 == '\0') goto LAB_0010bced;
              }
              if ((local_158 != iStack_150._M_current) &&
                 ((float)local_1a8._0_4_ < iStack_150._M_current[-1].row)) {
                aAppDebugPrintf("Error parsing %s rows: monotonic time expected",
                                *(undefined8 *)__args);
                goto LAB_0010bced;
              }
              if (iStack_150._M_current == local_148) {
                std::vector<AutomationBasic::Keypoint,std::allocator<AutomationBasic::Keypoint>>::
                _M_realloc_insert<AutomationBasic::Keypoint_const&>
                          ((vector<AutomationBasic::Keypoint,std::allocator<AutomationBasic::Keypoint>>
                            *)&local_158,iStack_150,(Keypoint *)local_1a8);
              }
              else {
                ((iStack_150._M_current)->value).w = local_198;
                (iStack_150._M_current)->row = (float)local_1a8._0_4_;
                ((iStack_150._M_current)->value).x = (float)local_1a8._4_4_;
                ((iStack_150._M_current)->value).y = (float)auStack_1a0._0_4_;
                ((iStack_150._M_current)->value).z = (float)auStack_1a0._4_4_;
                iStack_150._M_current = iStack_150._M_current + 1;
              }
              if ((local_168 == '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_188)->error_).error_ + 0x10U))) {
                operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
              }
              this_00 = this_00 + 1;
              bVar11 = this_00 == local_d8;
            }
            if (local_158 != iStack_150._M_current) {
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,AutomationBasic::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
              ::_M_emplace_unique<std::__cxx11::string_const,AutomationBasic::Variable>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,AutomationBasic::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
                          *)&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args
                         ,(Variable *)local_160);
            }
LAB_0010bd19:
            if (local_158 != (Keypoint *)0x0) {
              operator_delete(local_158,(long)local_148 - (long)local_158);
            }
            if ((local_120 == '\0') &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_140)->error_).error_ + 0x10U))) {
              operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
            }
            if (!bVar11) goto LAB_0010be94;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          } while (p_Var7 != local_e0);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::clear(&(local_118->data_)._M_t);
        if (local_110._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          (local_118->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_110._M_impl.super__Rb_tree_header._M_header._M_color;
          (local_118->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
          (local_118->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_110._M_impl.super__Rb_tree_header._M_header._M_left;
          (local_118->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_110._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_110._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &(local_118->data_)._M_t._M_impl.super__Rb_tree_header._M_header;
          (local_118->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_110._M_impl.super__Rb_tree_header._M_node_count;
          local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_110._M_impl.super__Rb_tree_header._M_header;
          local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_right =
               local_110._M_impl.super__Rb_tree_header._M_header._M_left;
        }
LAB_0010be94:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::~_Rb_tree(&local_110);
      }
      if ((local_b0 == '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                        *)local_d0)->error_).error_ + 0x10U))) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
    }
    Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a8.value_);
  }
  return;
}

Assistant:

void AutomationBasic::reread() {
	if (!source_->poll(++seq_))
		return;

	auto parsed = yaml::parse(source_->string());
	if (!parsed) {
		MSG("Automation parsing failed: %s", parsed.error().c_str());
		return;
	}
	auto map = parsed->getMapping();
	if (!map) {
		MSG("Automation must start with mapping: %s", map.error().c_str());
		return;
	}

	Data new_data;

	const yaml::Mapping &ymap = map.value();
	for(const auto &kv: ymap.map()) {
		const std::string &var = kv.first;
		auto sequence = kv.second.getSequence();
		if (!sequence) {
			MSG("Error parsing %s: %s", var.c_str(), sequence.error().c_str());
			return;
		}

		Variable variable = {0, {}};

		const yaml::Sequence &yseq = sequence.value();
		for (const auto &it: yseq) {
			auto row = it.getSequence();
			if (!row) {
				MSG("Error parsing %s row: %s", var.c_str(), row.error().c_str());
				return;
			}

			const yaml::Sequence &yrow = row.value();
			if (yrow.size() < 2) {
				MSG("Error parsing %s row: should be at least [t, x]", var.c_str());
				return;
			}

#define READ_FLOAT(i, name, to) \
			do { \
				auto float_string = yrow[i].getString(); \
				if (!float_string) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), float_string.error().c_str()); \
					return; \
				} \
				auto parsed_float = floatFromString(float_string.value()); \
				if (!parsed_float) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), parsed_float.error().c_str()); \
					return; \
				} \
				to = parsed_float.value(); \
			} while(0)

			if (yrow.size() > 5) {
				MSG("Error parsing %s row: too many components %d, max 4", var.c_str(), static_cast<int>(yrow.size()));
				return;
			}

			const int yrow_components = static_cast<int>(yrow.size() - 1);
			if (variable.components == 0) {
				variable.components = yrow_components;
			} else if (variable.components != yrow_components) {
				MSG("Error parsing %s row: inconsistent number of components %d, %d expected",
					var.c_str(), yrow_components, variable.components);
				return;
			}

			Keypoint kp = {0,{0,0,0,0}};
			READ_FLOAT(0, time, kp.row);
			READ_FLOAT(1, x, kp.value.x);
			if (yrow.size() > 2) READ_FLOAT(2, y, kp.value.y);
			if (yrow.size() > 3) READ_FLOAT(3, z, kp.value.z);
			if (yrow.size() > 4) READ_FLOAT(4, w, kp.value.w);

			if (!variable.sequence.empty() && variable.sequence.back().row > kp.row) {
				MSG("Error parsing %s rows: monotonic time expected", var.c_str());
				return;
			}

			variable.sequence.push_back(kp);
		}

		if (!variable.sequence.empty())
			new_data.emplace(std::move(var), std::move(variable));
	}

	data_ = std::move(new_data);
}